

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcCircleHollowProfileDef *in;
  
  in = (IfcCircleHollowProfileDef *)operator_new(0xb8);
  *(undefined ***)&in->field_0xa0 = &PTR__Object_007e4a70;
  *(undefined8 *)&in->field_0xa8 = 0;
  *(char **)&in->field_0xb0 = "IfcCircleHollowProfileDef";
  Assimp::IFC::Schema_2x3::IfcCircleProfileDef::IfcCircleProfileDef
            ((IfcCircleProfileDef *)in,&PTR_construction_vtable_24__008064b0);
  *(undefined8 *)&(in->super_IfcCircleProfileDef).field_0x90 = 0;
  (in->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCircleHollowProfileDef_008063f8;
  *(undefined ***)&in->field_0xa0 = &PTR__IfcCircleHollowProfileDef_00806498;
  *(undefined ***)
   &(in->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58
       = &PTR__IfcCircleHollowProfileDef_00806420;
  *(undefined ***)&(in->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.field_0x70 =
       &PTR__IfcCircleHollowProfileDef_00806448;
  *(undefined ***)&(in->super_IfcCircleProfileDef).field_0x88 =
       &PTR__IfcCircleHollowProfileDef_00806470;
  GenericFill<Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.
                 super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>
                 ._vptr_ObjectHelper +
         (long)(in->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
               [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }